

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O1

void __thiscall Blowfish_ECB_Test::TestBody(Blowfish_ECB_Test *this)

{
  int iVar1;
  EVP_CIPHER *pEVar2;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  BlowfishTestCase *key;
  ScopedTrace gtest_trace_67;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_;
  int out_bytes;
  int final_bytes;
  uint test_num;
  uint8_t out [16];
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  ScopedEVP_CIPHER_CTX ctx;
  ScopedTrace local_1d1;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  Bytes local_1c0;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  AssertHelper local_190;
  int local_184;
  int local_180;
  uint local_17c;
  long local_178 [2];
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [8];
  long local_d0;
  
  local_17c = 0;
  key = kTests;
  lVar4 = 0xc0;
  do {
    local_17c = local_17c + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_1d1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x43,&local_17c);
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
    pEVar2 = EVP_bf_ecb();
    iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,pEVar2,(ENGINE *)0x0,
                               key->key,(uchar *)0x0);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)
                 "EVP_EncryptInit_ex(ctx.get(), EVP_bf_ecb(), nullptr, test.key, nullptr)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x4a,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
LAB_00120592:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_168._1_7_,local_168[0]) != local_158) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_168._1_7_,local_168[0]),
                        local_158[0]._M_allocated_capacity + 1);
      }
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
      if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a8,local_1a8);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
LAB_001207d3:
      testing::ScopedTrace::~ScopedTrace(&local_1d1);
      return;
    }
    iVar1 = EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,0);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)"EVP_CIPHER_CTX_set_padding(ctx.get(), 0 )","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x4b,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      goto LAB_00120592;
    }
    local_d0 = lVar4;
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,(uchar *)local_178,
                              &local_184,key->plaintext,0x10);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)
                 "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x4d,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      goto LAB_00120592;
    }
    iVar1 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,
                                (uchar *)((long)local_178 + (long)local_184),&local_180);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)"EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x4e,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      goto LAB_00120592;
    }
    local_1b0 = (undefined1  [8])((long)local_180 + (long)local_184);
    local_1d0 = (undefined1  [8])0x10;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_168,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)local_1b0,(unsigned_long *)local_1d0);
    if (local_168[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b0);
      pcVar3 = "";
      if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
      if (local_1b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1b0 + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1d0 = (undefined1  [8])local_178;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
    local_1b0 = (undefined1  [8])key->ecb_ciphertext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_168,"Bytes(test.ecb_ciphertext)","Bytes(out)",(Bytes *)local_1b0,
               (Bytes *)local_1d0);
    if (local_168[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b0);
      pcVar3 = "";
      if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x51,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
      if (local_1b0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1b0 + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_168);
    pEVar2 = EVP_bf_ecb();
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_168,pEVar2,(ENGINE *)0x0,key->key,
                               (uchar *)0x0);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_ecb(), nullptr, test.key, nullptr)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x55,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
LAB_00120773:
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      if (local_1b0 != (undefined1  [8])&local_1a0) {
        operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
      }
      if ((long *)local_1c0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_1c0.span_.data_ + 8))();
      }
      if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c8,local_1c8);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_168);
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
      goto LAB_001207d3;
    }
    iVar1 = EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)local_168,0);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)"EVP_CIPHER_CTX_set_padding(decrypt_ctx.get(), 0 )","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x57,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
      goto LAB_00120773;
    }
    iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_168,(uchar *)local_178,&local_184,
                              key->ecb_ciphertext,0x10);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.ecb_ciphertext, sizeof(test.ecb_ciphertext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x5a,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
      goto LAB_00120773;
    }
    iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)local_168,
                                (uchar *)((long)local_178 + (long)local_184),&local_180);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x5c,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
      goto LAB_00120773;
    }
    local_1d0 = (undefined1  [8])((long)local_180 + (long)local_184);
    local_1c0.span_.data_ = &DAT_00000010;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_1b0,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)local_1d0,(unsigned_long *)&local_1c0);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d0);
      pcVar3 = "";
      if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_1a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x5e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,local_1a8);
    }
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1c0.span_.data_ = (uchar *)local_178;
    local_1c0.span_.size_ = 0x10;
    local_1d0 = (undefined1  [8])key->plaintext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1b0,"Bytes(test.plaintext)","Bytes(out)",(Bytes *)local_1d0,
               &local_1c0);
    lVar4 = local_d0;
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d0);
      pcVar3 = "";
      if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_1a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,local_1a8);
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_168);
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
    testing::ScopedTrace::~ScopedTrace(&local_1d1);
    key = key + 1;
    lVar4 = lVar4 + -0x60;
    if (lVar4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Blowfish, ECB) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.ecb_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_ecb(), nullptr, test.key,
                                   nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_set_padding(ctx.get(), 0 /* no padding */));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    ASSERT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.ecb_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_ecb(), nullptr,
                                   test.key, nullptr));
    ASSERT_TRUE(
        EVP_CIPHER_CTX_set_padding(decrypt_ctx.get(), 0 /* no padding */));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.ecb_ciphertext,
                                  sizeof(test.ecb_ciphertext)));
    ASSERT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out));
  }
}